

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O1

bool __thiscall DynamicGraph::checkComponentNotBreak(DynamicGraph *this,Vertex v,Vertex u,Edge e)

{
  pointer puVar1;
  Edge e_00;
  Edge e_01;
  bool bVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  *psVar5;
  Vertex VVar6;
  pointer this_00;
  bool bVar7;
  pair<std::_Rb_tree_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::_Rb_tree_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  pVar8;
  list<unsigned_long,_std::allocator<unsigned_long>_> incVertices;
  list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
  actions;
  list<unsigned_long,_std::allocator<unsigned_long>_> queue;
  list<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  _List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
  local_60;
  _List_node_base local_48;
  long local_38;
  
  puVar1 = (this->level).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1[v] == puVar1[u]) {
    this->halt = true;
    psVar5 = &(this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
              super__Vector_impl_data._M_start[v].b_sibl;
    pVar8 = std::
            _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
            ::equal_range(&psVar5->_M_t,&e);
    std::
    _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::_M_erase_aux(&psVar5->_M_t,(_Base_ptr)pVar8.first._M_node,(_Base_ptr)pVar8.second._M_node);
    psVar5 = &(this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
              super__Vector_impl_data._M_start[u].b_sibl;
    pVar8 = std::
            _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
            ::equal_range(&psVar5->_M_t,&e);
    std::
    _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::_M_erase_aux(&psVar5->_M_t,(_Base_ptr)pVar8.first._M_node,(_Base_ptr)pVar8.second._M_node);
  }
  puVar1 = (this->level).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1[v] != puVar1[u]) {
    local_60._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_60;
    local_60._M_impl._M_node._M_size = 0;
    local_78.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)&local_78;
    local_78.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node._M_size
         = 0;
    VVar6 = u;
    if (puVar1[v] < puVar1[u]) {
      VVar6 = v;
      v = u;
    }
    local_78.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
    super__List_node_base._M_prev =
         local_78.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
         super__List_node_base._M_next;
    local_60._M_impl._M_node.super__List_node_base._M_prev =
         local_60._M_impl._M_node.super__List_node_base._M_next;
    p_Var3 = (_List_node_base *)operator_new(0x28);
    e_00.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
         e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
    e_00.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
         e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
    e_00.m_eproperty = e.m_eproperty;
    Delete::Delete((Delete *)p_Var3,
                   &(this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>.
                    _M_impl.super__Vector_impl_data._M_start[VVar6].c_succ,e_00);
    p_Var4 = (_List_node_base *)operator_new(0x18);
    p_Var4[1]._M_next = p_Var3;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    local_60._M_impl._M_node._M_size = local_60._M_impl._M_node._M_size + 1;
    psVar5 = &(this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
              super__Vector_impl_data._M_start[VVar6].c_succ;
    pVar8 = std::
            _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
            ::equal_range(&psVar5->_M_t,&e);
    std::
    _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::_M_erase_aux(&psVar5->_M_t,(_Base_ptr)pVar8.first._M_node,(_Base_ptr)pVar8.second._M_node);
    p_Var3 = (_List_node_base *)operator_new(0x28);
    e_01.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
         e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
    e_01.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
         e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
    e_01.m_eproperty = e.m_eproperty;
    Delete::Delete((Delete *)p_Var3,
                   &(this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>.
                    _M_impl.super__Vector_impl_data._M_start[v].a_pred,e_01);
    p_Var4 = (_List_node_base *)operator_new(0x18);
    p_Var4[1]._M_next = p_Var3;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    local_60._M_impl._M_node._M_size = local_60._M_impl._M_node._M_size + 1;
    this_00 = (this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
              super__Vector_impl_data._M_start + v;
    pVar8 = std::
            _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
            ::equal_range((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                           *)this_00,&e);
    std::
    _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::_M_erase_aux((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                    *)this_00,(_Base_ptr)pVar8.first._M_node,(_Base_ptr)pVar8.second._M_node);
    bVar7 = *(size_t *)
             ((long)&(this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>.
                     _M_impl.super__Vector_impl_data._M_start[v].a_pred._M_t._M_impl + 0x28) == 0;
    if (bVar7) {
      local_38 = 0;
      local_48._M_next = &local_48;
      local_48._M_prev = &local_48;
      p_Var3 = (_List_node_base *)operator_new(0x18);
      p_Var3[1]._M_next = (_List_node_base *)v;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      local_38 = local_38 + 1;
      do {
        p_Var3 = local_48._M_next;
        if (local_48._M_next == &local_48) {
          this->halt = true;
          bVar2 = true;
          goto LAB_0010b456;
        }
        p_Var4 = local_48._M_next[1]._M_next;
        local_38 = local_38 + -1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var3,0x18);
        dropLevel(this,(Vertex)p_Var4,
                  (list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
                  (list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
                   *)&local_60,&local_78);
      } while (this->halt != true);
      rollBack(this,(list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
                     *)&local_60,&local_78);
      p_Var3 = local_48._M_next;
      while (p_Var3 != &local_48) {
        p_Var4 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var3->_M_next)->
                 _M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var3,0x18);
        p_Var3 = p_Var4;
      }
      bVar2 = false;
    }
    else {
      this->halt = true;
      bVar2 = false;
    }
LAB_0010b456:
    p_Var3 = local_78.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    while (p_Var3 != (_List_node_base *)&local_78) {
      p_Var4 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var3->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var3,0x18);
      p_Var3 = p_Var4;
    }
    std::__cxx11::
    _List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
    ::_M_clear(&local_60);
    if (!bVar2) {
      return !bVar7;
    }
  }
  return true;
}

Assistant:

bool DynamicGraph::checkComponentNotBreak(Vertex v, Vertex u, Edge e)
{
    // Case 1: v and u are on the same level
    if (this->level[v]==this->level[u]) {
        this->halt = true;
        this->relatives[v].b_sibl.erase(e);
        this->relatives[u].b_sibl.erase(e);
    }

    // Case 2: v and u are on different levels
    if (this->level[v]!=this->level[u]) {
        std::list<std::unique_ptr<Action>> actions; // changes stack
        std::list<Vertex> incVertices; // vertices dropped stack (each vertex multible times)
        // For Generality u in Li-1 and v Li
        if (this->level[v] < this->level[u]) {
            Vertex tmp = v;
            v = u;
            u = tmp;
        }

        actions.emplace_front(new Delete(this->relatives[u].c_succ, e));
        this->relatives[u].c_succ.erase(e);
        actions.emplace_front(new Delete(this->relatives[v].a_pred, e));
        this->relatives[v].a_pred.erase(e);

        // Case 2.1: a_pred(v) is not empty
        if(!this->relatives[v].a_pred.empty()) {
            this->halt = true;
            return true;
        }
        // Case 2.2 a_pred(v) is empty
        else {
            std::list<Vertex> queue;
            queue.push_back(v);

            // If Q is empty, the procedure and both processes halt
            while(!queue.empty()) {
                // Let w be the first element of Q. Remove w from Q
                Vertex w = queue.front();
                queue.pop_front();
                dropLevel(w, queue, actions, incVertices);

                // Repeat
                if(this->halt) {
                    this->rollBack(actions, incVertices);
                    return false;
                }
            }
        }
        this->halt = true;
    }
    return true;
}